

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::InsertEdgeIntoAEL(Clipper *this,TEdge *edge,TEdge *startEdge)

{
  _func_int **pp_Var1;
  long lVar2;
  long lVar3;
  TEdge *pTVar4;
  long lVar5;
  cInt cVar6;
  bool bVar7;
  double dVar8;
  
  pp_Var1 = this->_vptr_Clipper;
  pTVar4 = *(TEdge **)
            (pp_Var1[-3] + 0x10 +
            (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  if (pTVar4 == (TEdge *)0x0) {
    edge->NextInAEL = (TEdge *)0x0;
    edge->PrevInAEL = (TEdge *)0x0;
LAB_00111aff:
    pTVar4 = (TEdge *)((long)&this->_vptr_Clipper + (long)pp_Var1[-3]);
  }
  else {
    if (startEdge == (TEdge *)0x0) {
      lVar5 = (pTVar4->Curr).X;
      lVar2 = (edge->Curr).X;
      bVar7 = SBORROW8(lVar2,lVar5);
      lVar3 = lVar2 - lVar5;
      if (lVar2 == lVar5) {
        lVar5 = (edge->Top).Y;
        lVar2 = (pTVar4->Top).Y;
        if (lVar2 < lVar5) {
          dVar8 = (double)(lVar5 - (pTVar4->Bot).Y) * pTVar4->Dx;
          lVar5 = (long)(dVar8 + *(double *)(&DAT_0011d070 + (ulong)(dVar8 < 0.0) * 8)) +
                  (pTVar4->Bot).X;
          lVar3 = (edge->Top).X;
          bVar7 = SBORROW8(lVar3,lVar5);
          lVar3 = lVar3 - lVar5;
          goto LAB_00111a7f;
        }
        if (lVar5 == lVar2) {
          cVar6 = (edge->Top).X;
        }
        else {
          dVar8 = (double)(lVar2 - (edge->Bot).Y) * edge->Dx;
          cVar6 = (long)(dVar8 + *(double *)(&DAT_0011d070 + (ulong)(dVar8 < 0.0) * 8)) +
                  (edge->Bot).X;
        }
        bVar7 = cVar6 < (pTVar4->Top).X;
      }
      else {
LAB_00111a7f:
        bVar7 = bVar7 != lVar3 < 0;
      }
      startEdge = pTVar4;
      if (bVar7) {
        edge->PrevInAEL = (TEdge *)0x0;
        edge->NextInAEL =
             *(TEdge **)
              (pp_Var1[-3] + 0x10 +
              (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
        *(TEdge **)
         (*(long *)(pp_Var1[-3] + 0x10 +
                   (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>)
         + 0x70) = edge;
        goto LAB_00111aff;
      }
    }
    do {
      pTVar4 = startEdge;
      startEdge = pTVar4->NextInAEL;
      if (startEdge == (TEdge *)0x0) break;
      lVar5 = (startEdge->Curr).X;
      lVar2 = (edge->Curr).X;
      bVar7 = SBORROW8(lVar2,lVar5);
      lVar3 = lVar2 - lVar5;
      if (lVar2 == lVar5) {
        lVar5 = (edge->Top).Y;
        lVar2 = (startEdge->Top).Y;
        if (lVar2 < lVar5) {
          dVar8 = (double)(lVar5 - (startEdge->Bot).Y) * startEdge->Dx;
          lVar5 = (long)(dVar8 + *(double *)(&DAT_0011d070 + (ulong)(dVar8 < 0.0) * 8)) +
                  (startEdge->Bot).X;
          lVar3 = (edge->Top).X;
          bVar7 = SBORROW8(lVar3,lVar5);
          lVar3 = lVar3 - lVar5;
          goto LAB_00111b6d;
        }
        if (lVar5 == lVar2) {
          cVar6 = (edge->Top).X;
        }
        else {
          dVar8 = (double)(lVar2 - (edge->Bot).Y) * edge->Dx;
          cVar6 = (long)(dVar8 + *(double *)(&DAT_0011d070 + (ulong)(dVar8 < 0.0) * 8)) +
                  (edge->Bot).X;
        }
        bVar7 = cVar6 < (startEdge->Top).X;
      }
      else {
LAB_00111b6d:
        bVar7 = bVar7 != lVar3 < 0;
      }
    } while (!bVar7);
    edge->NextInAEL = startEdge;
    if (pTVar4->NextInAEL != (TEdge *)0x0) {
      pTVar4->NextInAEL->PrevInAEL = edge;
    }
    edge->PrevInAEL = pTVar4;
  }
  pTVar4->NextInAEL = edge;
  return;
}

Assistant:

void Clipper::InsertEdgeIntoAEL(TEdge *edge, TEdge* startEdge)
{
  if(!m_ActiveEdges)
  {
    edge->PrevInAEL = 0;
    edge->NextInAEL = 0;
    m_ActiveEdges = edge;
  }
  else if(!startEdge && E2InsertsBeforeE1(*m_ActiveEdges, *edge))
  {
      edge->PrevInAEL = 0;
      edge->NextInAEL = m_ActiveEdges;
      m_ActiveEdges->PrevInAEL = edge;
      m_ActiveEdges = edge;
  } 
  else
  {
    if(!startEdge) startEdge = m_ActiveEdges;
    while(startEdge->NextInAEL  && 
      !E2InsertsBeforeE1(*startEdge->NextInAEL , *edge))
        startEdge = startEdge->NextInAEL;
    edge->NextInAEL = startEdge->NextInAEL;
    if(startEdge->NextInAEL) startEdge->NextInAEL->PrevInAEL = edge;
    edge->PrevInAEL = startEdge;
    startEdge->NextInAEL = edge;
  }
}